

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

cmStateSnapshot * __thiscall
cmState::CreateBuildsystemDirectorySnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot)

{
  PositionType *this_00;
  pointer *ppcVar1;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar2;
  cmLinkedTree<cmDefinitions> *pcVar3;
  PositionType PVar4;
  iterator __position;
  iterator it;
  PositionType PVar5;
  PositionType PVar6;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar7;
  bool bVar8;
  PointerType pSVar9;
  PointerType pBVar10;
  PointerType pSVar11;
  iterator iVar12;
  iterator iVar13;
  iterator iVar14;
  PositionType pos;
  SnapshotDataType local_100;
  
  bVar8 = cmStateSnapshot::IsValid(originSnapshot);
  if (!bVar8) {
    __assert_fail("originSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x2e4,
                  "cmStateSnapshot cmState::CreateBuildsystemDirectorySnapshot(const cmStateSnapshot &)"
                 );
  }
  this_00 = &originSnapshot->Position;
  it.Tree = (originSnapshot->Position).Tree;
  it.Position = (originSnapshot->Position).Position;
  memset(&local_100,0,0xd0);
  local_100.ScopeParent =
       cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl(&this->SnapshotData,it,&local_100);
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  PVar5 = (originSnapshot->Position).Position;
  (pSVar9->DirectoryParent).Tree = (originSnapshot->Position).Tree;
  (pSVar9->DirectoryParent).Position = PVar5;
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  PVar5 = (originSnapshot->Position).Position;
  (pSVar9->ScopeParent).Tree = (originSnapshot->Position).Tree;
  (pSVar9->ScopeParent).Position = PVar5;
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar9->SnapshotType = BuildsystemDirectoryType;
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar9->Keep = true;
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  iVar12 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Push
                     (&this->BuildsystemDirectory,pSVar9->BuildSystemDirectory);
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar9->BuildSystemDirectory = iVar12;
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  iVar13 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Push(&this->ExecutionListFiles,pSVar9->ExecutionListFile);
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pSVar9->ExecutionListFile = iVar13;
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      (&pSVar9->BuildSystemDirectory);
  (pBVar10->DirectoryEnd).Tree = local_100.ScopeParent.Tree;
  (pBVar10->DirectoryEnd).Position = local_100.ScopeParent.Position;
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                      (&local_100.ScopeParent);
  PVar6 = (pSVar9->Policies).Position;
  (pSVar11->Policies).Tree = (pSVar9->Policies).Tree;
  (pSVar11->Policies).Position = PVar6;
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                      (&local_100.ScopeParent);
  PVar6 = (pSVar9->Policies).Position;
  (pSVar11->PolicyRoot).Tree = (pSVar9->Policies).Tree;
  (pSVar11->PolicyRoot).Position = PVar6;
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pSVar11 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                      (&local_100.ScopeParent);
  PVar6 = (pSVar9->Policies).Position;
  (pSVar11->PolicyScope).Tree = (pSVar9->Policies).Tree;
  (pSVar11->PolicyScope).Position = PVar6;
  pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_100.ScopeParent);
  pcVar2 = (pSVar9->Policies).Tree;
  if ((pcVar2 != (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) &&
     ((pSVar9->Policies).Position <=
      (ulong)(((long)(pcVar2->Data).
                     super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pcVar2->Data).
                     super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555))) {
    pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                       (&local_100.ScopeParent);
    pcVar2 = (pSVar9->PolicyRoot).Tree;
    if ((pcVar2 != (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) &&
       ((pSVar9->PolicyRoot).Position <=
        (ulong)(((long)(pcVar2->Data).
                       super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pcVar2->Data).
                       super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555))) {
      pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
      pcVar3 = (pSVar9->Vars).Tree;
      PVar4 = (pSVar9->Vars).Position;
      iVar14 = pSVar9->Vars;
      pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         (&local_100.ScopeParent);
      (pSVar9->Parent).Tree = pcVar3;
      (pSVar9->Parent).Position = PVar4;
      pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         (&local_100.ScopeParent);
      (pSVar9->Root).Tree = pcVar3;
      (pSVar9->Root).Position = PVar4;
      iVar14 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar14);
      pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                         (&local_100.ScopeParent);
      pSVar9->Vars = iVar14;
      cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,local_100.ScopeParent);
      pSVar9 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
      pBVar10 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                          (&pSVar9->BuildSystemDirectory);
      __position._M_current =
           (pBVar10->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pBVar10->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmStateSnapshot,std::allocator<cmStateSnapshot>>::
        _M_realloc_insert<cmStateSnapshot_const&>
                  ((vector<cmStateSnapshot,std::allocator<cmStateSnapshot>> *)&pBVar10->Children,
                   __position,__return_storage_ptr__);
      }
      else {
        ((__position._M_current)->Position).Position = (__return_storage_ptr__->Position).Position;
        pcVar7 = (__return_storage_ptr__->Position).Tree;
        (__position._M_current)->State = __return_storage_ptr__->State;
        ((__position._M_current)->Position).Tree = pcVar7;
        ppcVar1 = &(pBVar10->Children).
                   super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      cmStateSnapshot::SetDefaultDefinitions(__return_storage_ptr__);
      cmStateSnapshot::InitializeFromParent(__return_storage_ptr__);
      cmStateSnapshot::SetDirectoryDefinitions(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x2f4,
                  "cmStateSnapshot cmState::CreateBuildsystemDirectorySnapshot(const cmStateSnapshot &)"
                 );
  }
  __assert_fail("pos->Policies.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                ,0x2f3,
                "cmStateSnapshot cmState::CreateBuildsystemDirectorySnapshot(const cmStateSnapshot &)"
               );
}

Assistant:

cmStateSnapshot cmState::CreateBuildsystemDirectorySnapshot(
  cmStateSnapshot const& originSnapshot)
{
  assert(originSnapshot.IsValid());
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position);
  pos->DirectoryParent = originSnapshot.Position;
  pos->ScopeParent = originSnapshot.Position;
  pos->SnapshotType = cmStateEnums::BuildsystemDirectoryType;
  pos->Keep = true;
  pos->BuildSystemDirectory = this->BuildsystemDirectory.Push(
    originSnapshot.Position->BuildSystemDirectory);
  pos->ExecutionListFile =
    this->ExecutionListFiles.Push(originSnapshot.Position->ExecutionListFile);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->Policies = originSnapshot.Position->Policies;
  pos->PolicyRoot = originSnapshot.Position->Policies;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin = originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Root = origin;
  pos->Vars = this->VarTree.Push(origin);

  cmStateSnapshot snapshot = cmStateSnapshot(this, pos);
  originSnapshot.Position->BuildSystemDirectory->Children.push_back(snapshot);
  snapshot.SetDefaultDefinitions();
  snapshot.InitializeFromParent();
  snapshot.SetDirectoryDefinitions();
  return snapshot;
}